

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall soplex::SPxSteepPR<double>::selectEnterX(SPxSteepPR<double> *this,double tol)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  ulong *puVar5;
  SPxBasisBase<double> *pSVar6;
  SPxSteepPR<double> *this_00;
  long in_RDI;
  double *unaff_retaddr;
  SPxSteepPR<double> *in_stack_00000008;
  double bestCo;
  double best;
  SPxId enterCoId;
  SPxId enterId;
  DataKey local_68;
  DataKey local_60;
  DataKey local_58;
  DataKey local_50;
  DataKey in_stack_ffffffffffffffb8;
  DataKey in_stack_ffffffffffffffc0;
  DataKey local_28;
  DataKey local_20 [3];
  double in_stack_fffffffffffffff8;
  
  SPxId::SPxId((SPxId *)0x2ae683);
  SPxId::SPxId((SPxId *)0x2ae68d);
  pdVar4 = (double *)infinity();
  dVar1 = *pdVar4;
  puVar5 = (ulong *)infinity();
  this_00 = (SPxSteepPR<double> *)(*puVar5 ^ 0x8000000000000000);
  if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x89c) & 1) == 0) ||
     ((*(byte *)(in_RDI + 0x154) & 1) != 0)) {
    if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x899) & 1) == 0) ||
       ((*(byte *)(in_RDI + 0x154) & 1) != 0)) {
      local_60 = (DataKey)selectEnterDenseDim(this_00,(double *)in_stack_ffffffffffffffc0,
                                              (double)in_stack_ffffffffffffffb8);
    }
    else {
      local_60 = (DataKey)selectEnterSparseDim
                                    (this_00,(double *)in_stack_ffffffffffffffc0,
                                     (double)in_stack_ffffffffffffffb8);
    }
    local_28 = local_60;
    if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x89a) & 1) == 0) ||
       ((*(byte *)(in_RDI + 0x154) & 1) != 0)) {
      local_68 = (DataKey)selectEnterDenseCoDim
                                    (this_00,(double *)in_stack_ffffffffffffffc0,
                                     (double)in_stack_ffffffffffffffb8);
    }
    else {
      local_68 = (DataKey)selectEnterSparseCoDim
                                    (this_00,(double *)in_stack_ffffffffffffffc0,
                                     (double)in_stack_ffffffffffffffb8);
    }
    local_20[0] = local_68;
    goto LAB_002ae977;
  }
  iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0x108));
  if (iVar3 < 2) {
LAB_002ae735:
    if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x899) & 1) == 0) {
      in_stack_ffffffffffffffc0 =
           (DataKey)selectEnterDenseDim(this_00,(double *)in_stack_ffffffffffffffc0,
                                        (double)in_stack_ffffffffffffffb8);
      local_28 = in_stack_ffffffffffffffc0;
    }
    else {
      in_stack_ffffffffffffffc0 =
           (DataKey)buildBestPriceVectorEnterDim
                              (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
      local_28 = in_stack_ffffffffffffffc0;
    }
  }
  else {
    pSVar6 = SPxSolverBase<double>::basis(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    iVar3 = SPxBasisBase<double>::lastUpdate(pSVar6);
    if (iVar3 == 0) goto LAB_002ae735;
    if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x899) & 1) == 0) {
      in_stack_ffffffffffffffb8 =
           (DataKey)selectEnterDenseDim(this_00,(double *)in_stack_ffffffffffffffc0,
                                        (double)in_stack_ffffffffffffffb8);
      local_28 = in_stack_ffffffffffffffb8;
    }
    else {
      in_stack_ffffffffffffffb8 =
           (DataKey)selectEnterHyperDim(this_00,(double *)in_stack_ffffffffffffffc0,
                                        (double)in_stack_ffffffffffffffb8);
      local_28 = in_stack_ffffffffffffffb8;
    }
  }
  iVar3 = IdxSet::size((IdxSet *)(in_RDI + 0x128));
  if (1 < iVar3) {
    pSVar6 = SPxSolverBase<double>::basis(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    iVar3 = SPxBasisBase<double>::lastUpdate(pSVar6);
    if (iVar3 != 0) {
      if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x89a) & 1) == 0) {
        local_58 = (DataKey)selectEnterDenseCoDim
                                      (this_00,(double *)in_stack_ffffffffffffffc0,
                                       (double)in_stack_ffffffffffffffb8);
      }
      else {
        local_58 = (DataKey)selectEnterHyperCoDim
                                      (this_00,(double *)in_stack_ffffffffffffffc0,
                                       (double)in_stack_ffffffffffffffb8);
      }
      local_20[0] = local_58;
      goto LAB_002ae977;
    }
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x89a) & 1) == 0) {
    local_50 = (DataKey)selectEnterDenseCoDim
                                  (this_00,(double *)in_stack_ffffffffffffffc0,
                                   (double)in_stack_ffffffffffffffb8);
  }
  else {
    local_50 = (DataKey)buildBestPriceVectorEnterCoDim
                                  (in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
  }
  local_20[0] = local_50;
LAB_002ae977:
  bVar2 = SPxId::isValid((SPxId *)&local_28);
  if ((!bVar2) ||
     ((-dVar1 <= (double)this_00 * 0.8 && (bVar2 = SPxId::isValid((SPxId *)local_20), bVar2)))) {
    local_28 = local_20[0];
  }
  return (SPxId)local_28;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterX(R tol)
{
   SPxId enterId;
   SPxId enterCoId;
   R best;
   R bestCo;

   best = R(-infinity);
   bestCo = R(-infinity);

   if(this->thesolver->hyperPricingEnter && !refined)
   {
      if(bestPrices.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterCoId = (this->thesolver->sparsePricingEnter) ? buildBestPriceVectorEnterDim(best,
                     tol) : selectEnterDenseDim(best, tol);
      else
         enterCoId = (this->thesolver->sparsePricingEnter) ? selectEnterHyperDim(best,
                     tol) : selectEnterDenseDim(best, tol);

      if(bestPricesCo.size() < 2 || this->thesolver->basis().lastUpdate() == 0)
         enterId = (this->thesolver->sparsePricingEnterCo) ? buildBestPriceVectorEnterCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
      else
         enterId = (this->thesolver->sparsePricingEnterCo) ? selectEnterHyperCoDim(bestCo,
                   tol) : selectEnterDenseCoDim(bestCo, tol);
   }
   else
   {
      enterCoId = (this->thesolver->sparsePricingEnter
                   && !refined) ? selectEnterSparseDim(best, tol) : selectEnterDenseDim(best, tol);
      enterId = (this->thesolver->sparsePricingEnterCo
                 && !refined) ? selectEnterSparseCoDim(bestCo, tol) : selectEnterDenseCoDim(bestCo, tol);
   }

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterCoId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterId.isValid()))
      return enterCoId;
   else
      return enterId;
}